

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaCom.c
# Opt level: O0

void Pla_AbcFreeMan(Abc_Frame_t *pAbc)

{
  Pla_Man_t *p;
  Abc_Frame_t *pAbc_local;
  
  if (pAbc->pAbcPla != (void *)0x0) {
    p = Pla_AbcGetMan(pAbc);
    Pla_ManFree(p);
  }
  return;
}

Assistant:

static inline void        Pla_AbcFreeMan( Abc_Frame_t * pAbc )                   { if ( pAbc->pAbcPla ) Pla_ManFree(Pla_AbcGetMan(pAbc));  }